

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O1

Instruction *
spvtools::opt::anon_unknown_18::GetNonCopyObjectDef(DefUseManager *def_use_mgr,uint32_t inst_id)

{
  uint32_t index;
  Instruction *this;
  
  while( true ) {
    this = analysis::DefUseManager::GetDef(def_use_mgr,inst_id);
    if (this->opcode_ != OpCopyObject) break;
    index = (this->has_result_id_ & 1) + 1;
    if (this->has_type_id_ == false) {
      index = (uint)this->has_result_id_;
    }
    inst_id = Instruction::GetSingleWordOperand(this,index);
  }
  return this;
}

Assistant:

Instruction* GetNonCopyObjectDef(analysis::DefUseManager* def_use_mgr,
                                 uint32_t inst_id) {
  Instruction* inst = def_use_mgr->GetDef(inst_id);
  while (inst->opcode() == spv::Op::OpCopyObject) {
    inst_id = inst->GetSingleWordInOperand(0u);
    inst = def_use_mgr->GetDef(inst_id);
  }
  return inst;
}